

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.h
# Opt level: O2

Object<cmCMakePresetsGraph::ConfigurePreset> * __thiscall
cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::
Object<cmCMakePresetsGraph::ConfigurePreset>::
Bind<cmCMakePresetsGraph::Preset,std::shared_ptr<cmCMakePresetsGraph::Condition>,cmCMakePresetsGraph::ReadFileResult(*)(std::shared_ptr<cmCMakePresetsGraph::Condition>&,Json::Value_const*)>
          (Object<cmCMakePresetsGraph::ConfigurePreset> *this,string_view *name,
          offset_in_Preset_to_shared_ptr<cmCMakePresetsGraph::Condition> member,
          _func_ReadFileResult_shared_ptr<cmCMakePresetsGraph::Condition>_ptr_Value_ptr *func,
          bool required)

{
  Object<cmCMakePresetsGraph::ConfigurePreset> *pOVar1;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  local_10 = std::
             _Function_handler<cmCMakePresetsGraph::ReadFileResult_(cmCMakePresetsGraph::ConfigurePreset_&,_const_Json::Value_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmJSONHelpers.h:40:32)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<cmCMakePresetsGraph::ReadFileResult_(cmCMakePresetsGraph::ConfigurePreset_&,_const_Json::Value_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmJSONHelpers.h:40:32)>
             ::_M_manager;
  local_28._M_unused._0_8_ = (undefined8)func;
  local_28._8_8_ = member;
  pOVar1 = BindPrivate(this,name,(MemberFunction *)&local_28,required);
  std::_Function_base::~_Function_base((_Function_base *)&local_28);
  return pOVar1;
}

Assistant:

Object& Bind(const cm::string_view& name, M U::*member, F func,
                 bool required = true)
    {
      return this->BindPrivate(name,
                               [func, member](T& out, const Json::Value* value,
                                              CallState&&... state) -> E {
                                 return func(out.*member, value,
                                             std::forward(state)...);
                               },
                               required);
    }